

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_read_ppm(opj_j2k_t *j2k)

{
  opj_cp_t *poVar1;
  opj_cio_t *cio;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  
  poVar1 = j2k->cp;
  cio = j2k->cio;
  uVar3 = cio_read(cio,2);
  poVar1->ppm = 1;
  uVar4 = cio_read(cio,1);
  if (3 < (int)uVar3) {
    iVar7 = uVar3 - 3;
    do {
      uVar3 = poVar1->ppm_previous;
      if (uVar3 == 0) {
        uVar3 = cio_read(cio,4);
        iVar7 = iVar7 + -4;
      }
      iVar6 = poVar1->ppm_store;
      if (uVar4 == 0) {
        puVar5 = (uchar *)malloc((long)(int)uVar3);
        poVar1->ppm_data = puVar5;
        poVar1->ppm_data_first = puVar5;
        poVar1->ppm_len = uVar3;
      }
      else {
        puVar5 = (uchar *)realloc(poVar1->ppm_data,(long)(int)(uVar3 + iVar6));
        poVar1->ppm_data = puVar5;
        poVar1->ppm_data_first = puVar5;
        poVar1->ppm_len = poVar1->ppm_store + uVar3;
      }
      if (0 < (int)uVar3) {
        lVar8 = (long)iVar6;
        uVar9 = uVar3;
        do {
          iVar6 = iVar6 + 1;
          uVar3 = cio_read(cio,1);
          poVar1->ppm_data[lVar8] = (uchar)uVar3;
          if (iVar7 == 1) {
            iVar7 = 0;
            uVar3 = uVar9;
            break;
          }
          uVar3 = uVar9 - 1;
          lVar8 = lVar8 + 1;
          iVar7 = iVar7 + -1;
          bVar2 = 1 < (int)uVar9;
          uVar9 = uVar3;
        } while (bVar2);
      }
      poVar1->ppm_previous = uVar3 - 1;
      poVar1->ppm_store = iVar6;
    } while (0 < iVar7);
  }
  return;
}

Assistant:

static void j2k_read_ppm(opj_j2k_t *j2k) {
	int len, Z_ppm, i, j;
	int N_ppm;

	opj_cp_t *cp = j2k->cp;
	opj_cio_t *cio = j2k->cio;
	
	len = cio_read(cio, 2);
	cp->ppm = 1;
	
	Z_ppm = cio_read(cio, 1);	/* Z_ppm */
	len -= 3;
	while (len > 0) {
		if (cp->ppm_previous == 0) {
			N_ppm = cio_read(cio, 4);	/* N_ppm */
			len -= 4;
		} else {
			N_ppm = cp->ppm_previous;
		}
		j = cp->ppm_store;
		if (Z_ppm == 0) {	/* First PPM marker */
			cp->ppm_data = (unsigned char *) opj_malloc(N_ppm * sizeof(unsigned char));
			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm;
		} else {			/* NON-first PPM marker */
			cp->ppm_data = (unsigned char *) opj_realloc(cp->ppm_data, (N_ppm +	cp->ppm_store) * sizeof(unsigned char));

#ifdef USE_JPWL
			/* this memory allocation check could be done even in non-JPWL cases */
			if (cp->correct) {
				if (!cp->ppm_data) {
					opj_event_msg(j2k->cinfo, EVT_ERROR,
						"JPWL: failed memory allocation during PPM marker parsing (pos. %x)\n",
						cio_tell(cio));
					if (!JPWL_ASSUME || JPWL_ASSUME) {
						opj_free(cp->ppm_data);
						opj_event_msg(j2k->cinfo, EVT_ERROR, "JPWL: giving up\n");
						return;
					}
				}
			}
#endif

			cp->ppm_data_first = cp->ppm_data;
			cp->ppm_len = N_ppm + cp->ppm_store;
		}
		for (i = N_ppm; i > 0; i--) {	/* Read packet header */
			cp->ppm_data[j] = cio_read(cio, 1);
			j++;
			len--;
			if (len == 0)
				break;			/* Case of non-finished packet header in present marker but finished in next one */
		}
		cp->ppm_previous = i - 1;
		cp->ppm_store = j;
	}
}